

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

SimpleString __thiscall MemoryAccountant::report(MemoryAccountant *this)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  long lVar3;
  long *in_RSI;
  SimpleString *rhs;
  SimpleString SVar4;
  SimpleString accountantReport;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  if (*in_RSI == 0) {
    SimpleString::SimpleString
              ((SimpleString *)this,
               "CppUTest Memory Accountant has not noticed any allocations or deallocations. Sorry\n"
              );
    sVar2 = extraout_RDX_00;
  }
  else {
    reportTitle((MemoryAccountant *)local_60);
    reportHeader((MemoryAccountant *)local_50);
    rhs = (SimpleString *)local_60;
    SimpleString::operator+((SimpleString *)(local_50 + 0x10),rhs);
    SimpleString::~SimpleString((SimpleString *)local_50);
    SimpleString::~SimpleString((SimpleString *)local_60);
    lVar3 = *in_RSI;
    if (lVar3 != 0) {
      do {
        stringSize((MemoryAccountant *)local_50,(size_t)rhs);
        pcVar1 = SimpleString::asCharString((SimpleString *)local_50);
        StringFromFormat((char *)local_60,"%s               %5d            %5d             %5d\n",
                         pcVar1,(ulong)*(uint *)(lVar3 + 8),(ulong)*(uint *)(lVar3 + 0x10),
                         (ulong)*(uint *)(lVar3 + 0x18));
        rhs = (SimpleString *)local_60;
        SimpleString::operator+=((SimpleString *)(local_50 + 0x10),(SimpleString *)local_60);
        SimpleString::~SimpleString((SimpleString *)local_60);
        SimpleString::~SimpleString((SimpleString *)local_50);
        lVar3 = *(long *)(lVar3 + 0x28);
      } while (lVar3 != 0);
    }
    SimpleString::SimpleString((SimpleString *)local_60,"   Thank you for your business\n");
    SimpleString::operator+((SimpleString *)this,(SimpleString *)(local_50 + 0x10));
    SimpleString::~SimpleString((SimpleString *)local_60);
    SimpleString::~SimpleString((SimpleString *)(local_50 + 0x10));
    sVar2 = extraout_RDX;
  }
  SVar4.bufferSize_ = sVar2;
  SVar4.buffer_ = (char *)this;
  return SVar4;
}

Assistant:

SimpleString MemoryAccountant::report() const
{
    if (head_ == NULLPTR)
      return reportNoAllocations();

    SimpleString accountantReport = reportTitle() + reportHeader();

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
        accountantReport += StringFromFormat(MEMORY_ACCOUNTANT_ROW_FORMAT, stringSize(node->size_).asCharString(), (int) node->allocations_, (int) node->deallocations_, (int) node->maxAllocations_);

    return accountantReport + reportFooter();
}